

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valtype.h
# Opt level: O3

bool __thiscall wasm::analysis::ValType::meet(ValType *this,Element *meetee,Element meeter)

{
  Type a;
  bool bVar1;
  
  a.id = meetee->id;
  if (meeter.id == 0 || a.id == meeter.id) {
LAB_00ac3c09:
    bVar1 = false;
  }
  else {
    if (a.id != 0) {
      meeter.id = (uintptr_t)wasm::Type::getGreatestLowerBound(a,meeter.id);
      if (meeter.id == meetee->id) goto LAB_00ac3c09;
    }
    meetee->id = (uintptr_t)meeter;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool meet(Element& meetee, Element meeter) const noexcept {
    if (meetee == meeter || meeter == Type::none) {
      return false;
    }
    if (meetee == Type::none) {
      meetee = meeter;
      return true;
    }
    auto glb = Type::getGreatestLowerBound(meetee, meeter);
    if (glb != meetee) {
      meetee = glb;
      return true;
    }
    return false;
  }